

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O3

void NGA_Set_ghosts(int g_a,int *width)

{
  long lVar1;
  Integer *width_00;
  Integer _ga_work [7];
  Integer aIStack_48 [7];
  
  lVar1 = pnga_get_dimension((long)g_a);
  if (width == (int *)0x0) {
    width_00 = (Integer *)0x0;
  }
  else {
    width_00 = aIStack_48;
    if (0 < lVar1) {
      do {
        lVar1 = lVar1 + -1;
        aIStack_48[lVar1] = (long)*width;
        width = width + 1;
        width_00 = aIStack_48;
      } while (lVar1 != 0);
    }
  }
  pnga_set_ghosts((long)g_a,width_00);
  return;
}

Assistant:

void NGA_Set_ghosts(int g_a, int width[])
{
    Integer aa, *ptr, ndim;
    Integer _ga_work[MAXDIM];
    aa = (Integer)g_a;
    ndim = wnga_get_dimension(aa);
    if(!width)ptr=(Integer*)0;  
    else {
      COPYC2F(width,_ga_work, ndim);
      ptr = _ga_work;
    }
    wnga_set_ghosts(aa, ptr);
}